

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_derive.cpp
# Opt level: O3

void derive_functions::dermgvort
               (Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,Geometry *geomdata,
               Real param_7,int *param_8,int param_9)

{
  long lVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  double *pdVar16;
  double *pdVar17;
  EBCellFlagFab *this;
  EBCellFlag *pEVar18;
  int iVar19;
  double dVar20;
  double dVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  FabType FVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  int iVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  void *__s;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  bool bVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  int local_250;
  
  dVar20 = (geomdata->super_CoordSys).inv_dx[0];
  dVar21 = (geomdata->super_CoordSys).inv_dx[1];
  dVar2 = (geomdata->super_CoordSys).inv_dx[2];
  uVar3 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  uVar4 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  lVar56 = (long)(int)uVar4;
  uVar5 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar31 = (long)(int)(((datfab->super_BaseFab<double>).domain.bigend.vect[0] - uVar3) + 1);
  lVar57 = (long)(int)(((datfab->super_BaseFab<double>).domain.bigend.vect[1] - uVar4) + 1);
  lVar58 = lVar57 * lVar31;
  lVar32 = (long)(int)(((datfab->super_BaseFab<double>).domain.bigend.vect[2] - uVar5) + 1);
  lVar59 = lVar58 * lVar32;
  pdVar16 = (derfab->super_BaseFab<double>).dptr;
  iVar41 = (derfab->super_BaseFab<double>).domain.smallend.vect[0];
  lVar48 = (long)iVar41;
  iVar6 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  lVar53 = (long)iVar6;
  local_250 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar33 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar41) + 1);
  lVar34 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar6) + 1);
  lVar35 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[2] - local_250) + 1);
  lVar66 = (long)dcomp;
  pdVar17 = (datfab->super_BaseFab<double>).dptr;
  this = (EBCellFlagFab *)datfab[1].super_BaseFab<double>._vptr_BaseFab;
  FVar30 = amrex::EBCellFlagFab::getType(this,bx);
  if (FVar30 == singlevalued) {
    iVar41 = (bx->smallend).vect[2];
    iVar6 = (bx->bigend).vect[2];
    if (iVar41 <= iVar6) {
      iVar7 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
      iVar8 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
      iVar9 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      iVar10 = (this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
      iVar49 = (this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1];
      iVar11 = (bx->smallend).vect[0];
      lVar1 = (long)iVar11 * 8;
      lVar61 = lVar1 + (long)(int)uVar3 * -8;
      iVar12 = (bx->bigend).vect[0];
      iVar13 = (bx->bigend).vect[1];
      iVar14 = (bx->smallend).vect[1];
      pEVar18 = (this->super_BaseFab<amrex::EBCellFlag>).dptr;
      iVar38 = iVar11 - uVar3;
      lVar54 = lVar56 * -8;
      lVar37 = lVar32 * 8;
      lVar42 = lVar57 * 8;
      do {
        if (iVar14 <= iVar13) {
          iVar39 = iVar41 - uVar5;
          lVar45 = (long)iVar39;
          lVar55 = lVar58 * lVar45;
          lVar44 = (long)(int)((iVar41 + 1) - uVar5);
          lVar64 = (lVar32 * 0x10 + lVar45 * 8) * lVar57;
          lVar65 = lVar45 * lVar42;
          lVar43 = (long)iVar14;
          do {
            iVar40 = (int)lVar43;
            if (iVar11 <= iVar12) {
              lVar36 = (lVar43 - lVar56) * lVar31;
              lVar46 = (long)(int)((iVar40 + 1) - uVar4);
              lVar50 = (long)(int)((iVar40 - uVar4) + 2);
              lVar60 = (long)(int)((iVar40 - uVar4) + -2);
              lVar51 = (lVar64 + lVar54 + lVar43 * 8) * lVar31 + lVar61;
              lVar52 = ((lVar37 + lVar45 * 8) * lVar57 + lVar54 + lVar43 * 8) * lVar31 + lVar61;
              lVar22 = (lVar64 + (long)(int)(~uVar4 + iVar40) * 8) * lVar31 + lVar61;
              lVar23 = (lVar65 + (long)(int)(~uVar4 + iVar40) * 8) * lVar31 + lVar61;
              lVar24 = (lVar54 + lVar65 + lVar43 * 8) * lVar31 + lVar61;
              lVar25 = ((lVar37 + (long)(int)(~uVar5 + iVar41) * 8) * lVar57 + lVar54 + lVar43 * 8)
                       * lVar31 + lVar61;
              lVar26 = ((int)(~uVar5 + iVar41) * lVar42 + lVar54 + lVar43 * 8) * lVar31 + lVar61;
              lVar27 = ((lVar37 + lVar44 * 8) * lVar57 + lVar54 + lVar43 * 8) * lVar31 + lVar61;
              lVar28 = (lVar44 * lVar42 + lVar54 + lVar43 * 8) * lVar31 + lVar61;
              lVar29 = (lVar64 + lVar46 * 8) * lVar31 + lVar61;
              lVar46 = (lVar65 + lVar46 * 8) * lVar31 + lVar61;
              lVar47 = 0;
              do {
                uVar15 = *(uint32_t *)
                          ((long)&pEVar18[(iVar11 + lVar47) - (long)iVar7].flag +
                          ((long)(iVar41 - iVar9) * (long)((iVar49 - iVar8) + 1) * 4 +
                           (long)iVar8 * -4 + lVar43 * 4) * (long)((iVar10 - iVar7) + 1));
                dVar68 = 0.0;
                if ((~uVar15 & 3) != 0) {
                  iVar19 = (int)lVar47;
                  if ((uVar15 >> 0x13 & 1) == 0) {
                    lVar63 = (long)(int)(~uVar3 + iVar11 + iVar19);
                    lVar62 = (long)(int)((iVar11 - uVar3) + -2 + iVar19);
                    dVar68 = -(pdVar17[lVar36 + lVar55 + lVar62 + lVar59] * -0.5 +
                              *(double *)((long)pdVar17 + lVar47 * 8 + lVar52) * -1.5 +
                              pdVar17[lVar36 + lVar55 + lVar63 + lVar59] +
                              pdVar17[lVar36 + lVar55 + lVar63 + lVar59]);
                    dVar69 = -(pdVar17[lVar36 + lVar55 + lVar62 + lVar59 * 2] * -0.5 +
                              *(double *)((long)pdVar17 + lVar47 * 8 + lVar51) * -1.5 +
                              pdVar17[lVar36 + lVar55 + lVar63 + lVar59 * 2] +
                              pdVar17[lVar36 + lVar55 + lVar63 + lVar59 * 2]);
                  }
                  else if ((uVar15 >> 0x11 & 1) == 0) {
                    lVar63 = (long)(iVar38 + iVar19 + 1);
                    lVar62 = (long)(iVar38 + 2 + iVar19);
                    dVar68 = pdVar17[lVar36 + lVar55 + lVar62 + lVar59] * -0.5 +
                             *(double *)((long)pdVar17 + lVar47 * 8 + lVar52) * -1.5 +
                             pdVar17[lVar36 + lVar55 + lVar63 + lVar59] +
                             pdVar17[lVar36 + lVar55 + lVar63 + lVar59];
                    dVar69 = pdVar17[lVar36 + lVar55 + lVar62 + lVar59 * 2] * -0.5 +
                             *(double *)((long)pdVar17 + lVar47 * 8 + lVar51) * -1.5 +
                             pdVar17[lVar36 + lVar55 + lVar63 + lVar59 * 2] +
                             pdVar17[lVar36 + lVar55 + lVar63 + lVar59 * 2];
                  }
                  else {
                    lVar63 = (long)(iVar38 + iVar19 + 1);
                    lVar62 = (long)(int)(~uVar3 + iVar11 + iVar19);
                    dVar68 = (pdVar17[lVar36 + lVar55 + lVar63 + lVar59] -
                             pdVar17[lVar36 + lVar55 + lVar62 + lVar59]) * 0.5;
                    dVar69 = (pdVar17[lVar36 + lVar55 + lVar63 + lVar59 * 2] -
                             pdVar17[lVar36 + lVar55 + lVar62 + lVar59 * 2]) * 0.5;
                  }
                  if ((uVar15 >> 0x15 & 1) == 0) {
                    dVar70 = *(double *)((long)pdVar17 + lVar47 * 8 + lVar23);
                    dVar71 = *(double *)((long)pdVar17 + lVar47 * 8 + lVar22);
                    dVar70 = -(*(double *)
                                ((long)pdVar17 +
                                lVar47 * 8 + (lVar65 + lVar60 * 8) * lVar31 + lVar61) * -0.5 +
                              *(double *)((long)pdVar17 + lVar47 * 8 + lVar24) * -1.5 +
                              dVar70 + dVar70);
                    dVar71 = -(*(double *)
                                ((long)pdVar17 +
                                lVar47 * 8 + (lVar64 + lVar60 * 8) * lVar31 + lVar61) * -0.5 +
                              *(double *)((long)pdVar17 + lVar47 * 8 + lVar51) * -1.5 +
                              dVar71 + dVar71);
                  }
                  else if ((short)uVar15 < 0) {
                    dVar70 = (*(double *)((long)pdVar17 + lVar47 * 8 + lVar46) -
                             *(double *)((long)pdVar17 + lVar47 * 8 + lVar23)) * 0.5;
                    dVar71 = (*(double *)((long)pdVar17 + lVar47 * 8 + lVar29) -
                             *(double *)((long)pdVar17 + lVar47 * 8 + lVar22)) * 0.5;
                  }
                  else {
                    dVar70 = *(double *)((long)pdVar17 + lVar47 * 8 + lVar46);
                    dVar71 = *(double *)((long)pdVar17 + lVar47 * 8 + lVar29);
                    dVar70 = *(double *)
                              ((long)pdVar17 + lVar47 * 8 + (lVar65 + lVar50 * 8) * lVar31 + lVar61)
                             * -0.5 + *(double *)((long)pdVar17 + lVar47 * 8 + lVar24) * -1.5 +
                                      dVar70 + dVar70;
                    dVar71 = *(double *)
                              ((long)pdVar17 + lVar47 * 8 + (lVar64 + lVar50 * 8) * lVar31 + lVar61)
                             * -0.5 + *(double *)((long)pdVar17 + lVar47 * 8 + lVar51) * -1.5 +
                                      dVar71 + dVar71;
                  }
                  if ((uVar15 >> 0x1b & 1) == 0) {
                    dVar72 = *(double *)((long)pdVar17 + lVar47 * 8 + lVar26);
                    dVar73 = *(double *)((long)pdVar17 + lVar47 * 8 + lVar25);
                    dVar72 = -(*(double *)
                                ((long)pdVar17 +
                                lVar47 * 8 +
                                ((iVar39 + -2) * lVar42 + lVar54 + lVar43 * 8) * lVar31 + lVar61) *
                               -0.5 + *(double *)((long)pdVar17 + lVar47 * 8 + lVar24) * -1.5 +
                                      dVar72 + dVar72);
                    dVar73 = -(*(double *)
                                ((long)pdVar17 +
                                lVar47 * 8 +
                                ((lVar37 + (long)(iVar39 + -2) * 8) * lVar57 + lVar54 + lVar43 * 8)
                                * lVar31 + lVar61) * -0.5 +
                              *(double *)((long)pdVar17 + lVar47 * 8 + lVar52) * -1.5 +
                              dVar73 + dVar73);
                  }
                  else if ((uVar15 >> 9 & 1) == 0) {
                    dVar72 = *(double *)((long)pdVar17 + lVar47 * 8 + lVar28);
                    dVar73 = *(double *)((long)pdVar17 + lVar47 * 8 + lVar27);
                    dVar72 = *(double *)
                              ((long)pdVar17 +
                              lVar47 * 8 +
                              ((iVar39 + 2) * lVar42 + lVar54 + lVar43 * 8) * lVar31 + lVar61) *
                             -0.5 + *(double *)((long)pdVar17 + lVar47 * 8 + lVar24) * -1.5 +
                                    dVar72 + dVar72;
                    dVar73 = *(double *)
                              ((long)pdVar17 +
                              lVar47 * 8 +
                              ((lVar37 + (long)(iVar39 + 2) * 8) * lVar57 + lVar54 + lVar43 * 8) *
                              lVar31 + lVar61) * -0.5 +
                             *(double *)((long)pdVar17 + lVar47 * 8 + lVar52) * -1.5 +
                             dVar73 + dVar73;
                  }
                  else {
                    dVar72 = (*(double *)((long)pdVar17 + lVar47 * 8 + lVar28) -
                             *(double *)((long)pdVar17 + lVar47 * 8 + lVar26)) * 0.5;
                    dVar73 = (*(double *)((long)pdVar17 + lVar47 * 8 + lVar27) -
                             *(double *)((long)pdVar17 + lVar47 * 8 + lVar25)) * 0.5;
                  }
                  dVar70 = dVar20 * dVar68 - dVar70 * dVar21;
                  dVar68 = dVar2 * dVar72 - dVar69 * dVar20;
                  dVar69 = dVar21 * dVar71 - dVar73 * dVar2;
                  dVar68 = SQRT(dVar70 * dVar70 + dVar69 * dVar69 + dVar68 * dVar68);
                }
                *(double *)
                 ((long)pdVar16 +
                 lVar47 * 8 +
                 ((lVar66 * lVar35 * 8 + (long)local_250 * -8 + (long)iVar41 * 8) * lVar34 +
                  lVar53 * -8 + lVar43 * 8) * lVar33 + lVar1 + lVar48 * -8) = dVar68;
                lVar47 = lVar47 + 1;
              } while ((iVar12 - iVar11) + 1 != (int)lVar47);
            }
            lVar43 = lVar43 + 1;
          } while (iVar13 + 1 != iVar40 + 1);
        }
        iVar41 = iVar41 + 1;
      } while (iVar41 != iVar6 + 1);
    }
  }
  else if (FVar30 == covered) {
    iVar41 = (bx->smallend).vect[2];
    iVar6 = (bx->bigend).vect[2];
    if (iVar41 <= iVar6) {
      iVar7 = (bx->smallend).vect[1];
      iVar8 = (bx->bigend).vect[0];
      iVar9 = (bx->bigend).vect[1];
      iVar10 = (bx->smallend).vect[0];
      local_250 = iVar41 - local_250;
      do {
        if (iVar7 <= iVar9) {
          __s = (void *)((long)pdVar16 +
                        ((long)local_250 * lVar34 * lVar33 + (long)iVar10) * 8 +
                        ((long)iVar7 * 8 + lVar66 * lVar34 * lVar35 * 8 + lVar53 * -8) * lVar33 +
                        lVar48 * -8);
          iVar49 = (iVar9 - iVar7) + 1;
          do {
            if (iVar10 <= iVar8) {
              memset(__s,0,(ulong)(uint)(iVar8 - iVar10) * 8 + 8);
            }
            __s = (void *)((long)__s + lVar33 * 8);
            iVar49 = iVar49 + -1;
          } while (iVar49 != 0);
        }
        local_250 = local_250 + 1;
        bVar67 = iVar41 != iVar6;
        iVar41 = iVar41 + 1;
      } while (bVar67);
    }
  }
  else {
    iVar41 = (bx->smallend).vect[2];
    iVar6 = (bx->bigend).vect[2];
    if (iVar41 <= iVar6) {
      iVar7 = (bx->bigend).vect[0];
      iVar8 = (bx->bigend).vect[1];
      iVar9 = (bx->smallend).vect[1];
      iVar10 = (bx->smallend).vect[0];
      lVar54 = (long)iVar10 * 8 + (long)(int)uVar3 * -8;
      lVar42 = lVar56 * -8;
      lVar1 = lVar57 * 8;
      do {
        if (iVar9 <= iVar8) {
          lVar43 = lVar58 * (int)(iVar41 - uVar5);
          lVar64 = (long)(int)((iVar41 + 1) - uVar5);
          lVar37 = (lVar32 * 0x10 + (long)(int)uVar5 * -8 + (long)iVar41 * 8) * lVar57;
          lVar55 = (int)(iVar41 - uVar5) * lVar1;
          lVar61 = (long)iVar9;
          do {
            iVar49 = (int)lVar61;
            if (iVar10 <= iVar7) {
              lVar44 = (lVar61 - lVar56) * lVar31;
              lVar45 = (long)(int)((iVar49 + 1) - uVar4);
              lVar65 = 0;
              do {
                lVar51 = (long)(int)((iVar10 - uVar3) + 1 + (int)lVar65);
                lVar52 = (long)(int)(~uVar3 + iVar10 + (int)lVar65);
                dVar70 = (*(double *)
                           ((long)pdVar17 + lVar65 * 8 + (lVar37 + lVar45 * 8) * lVar31 + lVar54) -
                         *(double *)
                          ((long)pdVar17 +
                          lVar65 * 8 + (lVar37 + (long)(int)(iVar49 + ~uVar4) * 8) * lVar31 + lVar54
                          )) * 0.5 * dVar21 -
                         (*(double *)
                           ((long)pdVar17 +
                           lVar65 * 8 +
                           ((lVar32 * 8 + lVar64 * 8) * lVar57 + lVar42 + lVar61 * 8) * lVar31 +
                           lVar54) -
                         *(double *)
                          ((long)pdVar17 +
                          lVar65 * 8 +
                          ((lVar32 * 8 + (long)(int)(~uVar5 + iVar41) * 8) * lVar57 + lVar42 +
                          lVar61 * 8) * lVar31 + lVar54)) * 0.5 * dVar2;
                dVar69 = (*(double *)
                           ((long)pdVar17 +
                           lVar65 * 8 + (lVar64 * lVar1 + lVar42 + lVar61 * 8) * lVar31 + lVar54) -
                         *(double *)
                          ((long)pdVar17 +
                          lVar65 * 8 +
                          ((int)(~uVar5 + iVar41) * lVar1 + lVar42 + lVar61 * 8) * lVar31 + lVar54))
                         * 0.5 * dVar2 -
                         (pdVar17[lVar44 + lVar43 + lVar51 + lVar59 * 2] -
                         pdVar17[lVar44 + lVar43 + lVar52 + lVar59 * 2]) * 0.5 * dVar20;
                dVar68 = (pdVar17[lVar44 + lVar43 + lVar51 + lVar59] -
                         pdVar17[lVar44 + lVar43 + lVar52 + lVar59]) * 0.5 * dVar20 -
                         (*(double *)
                           ((long)pdVar17 + lVar65 * 8 + (lVar55 + lVar45 * 8) * lVar31 + lVar54) -
                         *(double *)
                          ((long)pdVar17 +
                          lVar65 * 8 + (lVar55 + (long)(int)(iVar49 + ~uVar4) * 8) * lVar31 + lVar54
                          )) * 0.5 * dVar21;
                *(double *)
                 ((long)pdVar16 +
                 lVar65 * 8 +
                 ((lVar66 * lVar35 * 8 + (long)local_250 * -8 + (long)iVar41 * 8) * lVar34 +
                  lVar53 * -8 + lVar61 * 8) * lVar33 + (long)iVar10 * 8 + lVar48 * -8) =
                     SQRT(dVar68 * dVar68 + dVar70 * dVar70 + dVar69 * dVar69);
                lVar65 = lVar65 + 1;
              } while ((iVar7 - iVar10) + 1 != (int)lVar65);
            }
            lVar61 = lVar61 + 1;
          } while (iVar49 + 1 != iVar8 + 1);
        }
        iVar41 = iVar41 + 1;
      } while (iVar41 != iVar6 + 1);
    }
  }
  return;
}

Assistant:

void dermgvort (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
		  const FArrayBox& datfab, const Geometry& geomdata,
		  Real /*time*/, const int* /*bcrec*/, int /*level*/)

  {
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= AMREX_SPACEDIM);
    AMREX_ASSERT(ncomp == 1);

    AMREX_D_TERM(const amrex::Real idx = geomdata.InvCellSize(0);,
                 const amrex::Real idy = geomdata.InvCellSize(1);,
                 const amrex::Real idz = geomdata.InvCellSize(2););

    amrex::Array4<amrex::Real const> const& dat_arr = datfab.const_array();
    amrex::Array4<amrex::Real>       const&vort_arr = derfab.array(dcomp);

#ifdef AMREX_USE_EB
    const EBFArrayBox& ebfab = static_cast<EBFArrayBox const&>(datfab);
    const EBCellFlagFab& flags = ebfab.getEBCellFlagFab();
    auto typ = flags.getType(bx);
    if (typ == FabType::covered)
    {
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            vort_arr(i,j,k) = 0.0;
        });
    } else if (typ == FabType::singlevalued)
    {
	const auto& flag_fab = flags.const_array();
	amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
	{
	  constexpr amrex::Real c0 = -1.5;
	  constexpr amrex::Real c1 = 2.0;
	  constexpr amrex::Real c2 = -0.5;
	  if (flag_fab(i,j,k).isCovered()) {
	    vort_arr(i,j,k) = 0.0;
	  } else {
	    amrex::Real vx = 0.0;
	    amrex::Real uy = 0.0;

#if ( AMREX_SPACEDIM == 2 )

	    // Need to check if there are covered cells in neighbours --
	    // -- if so, use one-sided difference computation (but still quadratic)
	    if (!flag_fab(i,j,k).isConnected( 1,0,0)) {
	      vx = - (c0 * dat_arr(i  ,j,k,1)
		      + c1 * dat_arr(i-1,j,k,1)
		      + c2 * dat_arr(i-2,j,k,1)) * idx;
	    } else if (!flag_fab(i,j,k).isConnected(-1,0,0)) {
	      vx = (c0 * dat_arr(i  ,j,k,1)
		    + c1 * dat_arr(i+1,j,k,1)
		    + c2 * dat_arr(i+2,j,k,1)) * idx;
	    } else {
	      vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
	    }
	    // Do the same in y-direction
	    if (!flag_fab(i,j,k).isConnected( 0,1,0)) {
	      uy = - (c0 * dat_arr(i,j  ,k,0)
		      + c1 * dat_arr(i,j-1,k,0)
		      + c2 * dat_arr(i,j-2,k,0)) * idy;
	    } else if (!flag_fab(i,j,k).isConnected(0,-1,0)) {
	      uy = (c0 * dat_arr(i,j  ,k,0)
		    + c1 * dat_arr(i,j+1,k,0)
		    + c2 * dat_arr(i,j+2,k,0)) * idy;
	    } else {
	      uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
	    }

	    vort_arr(i,j,k) = amrex::Math::abs(vx-uy);


#elif ( AMREX_SPACEDIM == 3 )

	    amrex::Real wx = 0.0;
	    amrex::Real wy = 0.0;
	    amrex::Real uz = 0.0;
	    amrex::Real vz = 0.0;
	    // Need to check if there are covered cells in neighbours --
	    // -- if so, use one-sided difference computation (but still quadratic)
	    if (!flag_fab(i,j,k).isConnected( 1,0,0)) {
	      // Covered cell to the right, go fish left
	      vx = - (c0 * dat_arr(i  ,j,k,1)
		      + c1 * dat_arr(i-1,j,k,1)
		      + c2 * dat_arr(i-2,j,k,1)) * idx;
	      wx = - (c0 * dat_arr(i  ,j,k,2)
		      + c1 * dat_arr(i-1,j,k,2)
		      + c2 * dat_arr(i-2,j,k,2)) * idx;
	    } else if (!flag_fab(i,j,k).isConnected(-1,0,0)) {
	      // Covered cell to the left, go fish right
	      vx = (c0 * dat_arr(i  ,j,k,1)
		    + c1 * dat_arr(i+1,j,k,1)
		    + c2 * dat_arr(i+2,j,k,1)) * idx;
	      wx = (c0 * dat_arr(i  ,j,k,2)
		    + c1 * dat_arr(i+1,j,k,2)
		    + c2 * dat_arr(i+2,j,k,2)) * idx;
	    } else {
	      // No covered cells right or left, use standard stencil
	      vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
	      wx = 0.5 * (dat_arr(i+1,j,k,2) - dat_arr(i-1,j,k,2)) * idx;
	    }
	    // Do the same in y-direction
	    if (!flag_fab(i,j,k).isConnected(0, 1,0)) {
	      uy = - (c0 * dat_arr(i,j  ,k,0)
		      + c1 * dat_arr(i,j-1,k,0)
		      + c2 * dat_arr(i,j-2,k,0)) * idy;
	      wy = - (c0 * dat_arr(i,j  ,k,2)
		      + c1 * dat_arr(i,j-1,k,2)
		      + c2 * dat_arr(i,j-2,k,2)) * idy;
	    } else if (!flag_fab(i,j,k).isConnected(0,-1,0)) {
	      uy = (c0 * dat_arr(i,j  ,k,0)
		    + c1 * dat_arr(i,j+1,k,0)
		    + c2 * dat_arr(i,j+2,k,0)) * idy;
	      wy = (c0 * dat_arr(i,j  ,k,2)
		    + c1 * dat_arr(i,j+1,k,2)
		    + c2 * dat_arr(i,j+2,k,2)) * idy;
	    } else {
	      uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
	      wy = 0.5 * (dat_arr(i,j+1,k,2) - dat_arr(i,j-1,k,2)) * idy;
	    }
	    // Do the same in z-direction
	    if (!flag_fab(i,j,k).isConnected(0,0, 1)) {
	      uz = - (c0 * dat_arr(i,j,k  ,0)
		      + c1 * dat_arr(i,j,k-1,0)
		      + c2 * dat_arr(i,j,k-2,0)) * idz;
	      vz = - (c0 * dat_arr(i,j,k  ,1)
		      + c1 * dat_arr(i,j,k-1,1)
		      + c2 * dat_arr(i,j,k-2,1)) * idz;
	    } else if (!flag_fab(i,j,k).isConnected(0,0,-1)) {
	      uz = (c0 * dat_arr(i,j,k  ,0)
		    + c1 * dat_arr(i,j,k+1,0)
		    + c2 * dat_arr(i,j,k+2,0)) * idz;
	      vz = (c0 * dat_arr(i,j,k  ,1)
		    + c1 * dat_arr(i,j,k+1,1)
		    + c2 * dat_arr(i,j,k+2,1)) * idz;
	    } else {
	      uz = 0.5 * (dat_arr(i,j,k+1,0) - dat_arr(i,j,k-1,0)) * idz;
	      vz = 0.5 * (dat_arr(i,j,k+1,1) - dat_arr(i,j,k-1,1)) * idz;
	    }

	    vort_arr(i,j,k) = std::sqrt((wy-vz)*(wy-vz) + (uz-wx)*(uz-wx) + (vx-uy)*(vx-uy));

#endif
	  }
	});
    } else // non-EB
#endif
      {
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
#if ( AMREX_SPACEDIM == 2 )

	  amrex::Real vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
	  amrex::Real uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;

	  vort_arr(i,j,k) = amrex::Math::abs(vx-uy);


#elif ( AMREX_SPACEDIM == 3 )

	  amrex::Real vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
	  amrex::Real wx = 0.5 * (dat_arr(i+1,j,k,2) - dat_arr(i-1,j,k,2)) * idx;

	  amrex::Real uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
	  amrex::Real wy = 0.5 * (dat_arr(i,j+1,k,2) - dat_arr(i,j-1,k,2)) * idy;

	  amrex::Real uz = 0.5 * (dat_arr(i,j,k+1,0) - dat_arr(i,j,k-1,0)) * idz;
	  amrex::Real vz = 0.5 * (dat_arr(i,j,k+1,1) - dat_arr(i,j,k-1,1)) * idz;

	  vort_arr(i,j,k) = std::sqrt((wy-vz)*(wy-vz) + (uz-wx)*(uz-wx) + (vx-uy)*(vx-uy));
#endif
	});
      }
  }